

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O0

void __thiscall Exception::Exception(Exception *this,char *err_msg_par,char c_par)

{
  size_t sVar1;
  char *pcVar2;
  char c_par_local;
  char *err_msg_par_local;
  Exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__Exception_0013ad68;
  std::__cxx11::string::string((string *)&this->err_word);
  sVar1 = strlen(err_msg_par);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  this->err_msg = pcVar2;
  strcpy(this->err_msg,err_msg_par);
  std::__cxx11::string::operator+=((string *)&this->err_word,c_par);
  return;
}

Assistant:

Exception::Exception(const char *err_msg_par, const char c_par) {
    err_msg = new char[strlen(err_msg_par) + 1];
    strcpy(err_msg, err_msg_par);
    err_word += c_par;
}